

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unredacted_debug_format_for_test_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_15949f2::UnredactedDebugFormatAPITest_MessageUnredactedUtf8DebugFormat_Test::
TestBody(UnredactedDebugFormatAPITest_MessageUnredactedUtf8DebugFormat_Test *this)

{
  TestNestedMessageRedaction *pTVar1;
  PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *matcher;
  Message *message;
  char *message_00;
  AssertionResult gtest_ar;
  string local_1e0;
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1c0;
  TestNestedMessageRedaction unredacted_nested_proto;
  TestNestedMessageRedaction redacted_nested_proto;
  PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_148;
  RedactedFields proto;
  
  proto2_unittest::RedactedFields::RedactedFields(&proto);
  proto2_unittest::TestNestedMessageRedaction::TestNestedMessageRedaction(&redacted_nested_proto);
  proto2_unittest::TestNestedMessageRedaction::TestNestedMessageRedaction(&unredacted_nested_proto);
  redacted_nested_proto.field_0._impl_._has_bits_.has_bits_[0]._0_1_ =
       redacted_nested_proto.field_0._impl_._has_bits_.has_bits_[0]._0_1_ | 1;
  if ((redacted_nested_proto.super_Message.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
    redacted_nested_proto.super_Message.super_MessageLite._internal_metadata_.ptr_ =
         *(undefined8 *)
          (redacted_nested_proto.super_Message.super_MessageLite._internal_metadata_.ptr_ &
          0xfffffffffffffffe);
  }
  google::protobuf::internal::ArenaStringPtr::Set
            (&redacted_nested_proto.field_0._impl_.optional_unredacted_nested_string_,
             anon_var_dwarf_1657d4b + 0xf,
             (Arena *)redacted_nested_proto.super_Message.super_MessageLite._internal_metadata_.ptr_
            );
  unredacted_nested_proto.field_0._impl_._has_bits_.has_bits_[0]._0_1_ =
       unredacted_nested_proto.field_0._impl_._has_bits_.has_bits_[0]._0_1_ | 1;
  if ((unredacted_nested_proto.super_Message.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0)
  {
    unredacted_nested_proto.super_Message.super_MessageLite._internal_metadata_.ptr_ =
         *(undefined8 *)
          (unredacted_nested_proto.super_Message.super_MessageLite._internal_metadata_.ptr_ &
          0xfffffffffffffffe);
  }
  google::protobuf::internal::ArenaStringPtr::Set
            (&unredacted_nested_proto.field_0._impl_.optional_unredacted_nested_string_,
             anon_var_dwarf_1657d4b + 0xf,
             (Arena *)unredacted_nested_proto.super_Message.super_MessageLite._internal_metadata_.
                      ptr_);
  pTVar1 = proto2_unittest::RedactedFields::mutable_optional_redacted_message(&proto);
  proto2_unittest::TestNestedMessageRedaction::CopyFrom(pTVar1,&redacted_nested_proto);
  pTVar1 = proto2_unittest::RedactedFields::mutable_optional_unredacted_message(&proto);
  proto2_unittest::TestNestedMessageRedaction::CopyFrom(pTVar1,&unredacted_nested_proto);
  testing::StrEq<char[155]>(&local_148,&anon_var_dwarf_1597b27);
  testing::internal::
  MakePredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::string>>>
            (&local_1c0,(internal *)&local_148,matcher);
  google::protobuf::util::UnredactedUtf8DebugFormatForTest_abi_cxx11_
            (&local_1e0,(util *)&proto,message);
  testing::internal::
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::string>>>
  ::operator()(&gtest_ar,(char *)&local_1c0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               "UnredactedUtf8DebugFormatForTest(proto)");
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_148);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_1c0);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      message_00 = anon_var_dwarf_651463 + 5;
    }
    else {
      message_00 = *(char **)gtest_ar.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/unredacted_debug_format_for_test_test.cc"
               ,0x44,message_00);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1e0,(Message *)&local_1c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1e0);
    if ((long *)local_1c0.matcher_.impl_.string_._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_1c0.matcher_.impl_.string_._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  proto2_unittest::TestNestedMessageRedaction::~TestNestedMessageRedaction(&unredacted_nested_proto)
  ;
  proto2_unittest::TestNestedMessageRedaction::~TestNestedMessageRedaction(&redacted_nested_proto);
  proto2_unittest::RedactedFields::~RedactedFields(&proto);
  return;
}

Assistant:

TEST(UnredactedDebugFormatAPITest, MessageUnredactedUtf8DebugFormat) {
  proto2_unittest::RedactedFields proto;
  proto2_unittest::TestNestedMessageRedaction redacted_nested_proto;
  proto2_unittest::TestNestedMessageRedaction unredacted_nested_proto;
  redacted_nested_proto.set_optional_unredacted_nested_string(
      "\350\260\267\346\255\214");
  unredacted_nested_proto.set_optional_unredacted_nested_string(
      "\350\260\267\346\255\214");
  *proto.mutable_optional_redacted_message() = redacted_nested_proto;
  *proto.mutable_optional_unredacted_message() = unredacted_nested_proto;

  EXPECT_THAT(UnredactedUtf8DebugFormatForTest(proto),
              StrEq("optional_redacted_message {\n  "
                    "optional_unredacted_nested_string: "
                    "\"\xE8\xB0\xB7\xE6\xAD\x8C\"\n}\n"
                    "optional_unredacted_message {\n  "
                    "optional_unredacted_nested_string: "
                    "\"\xE8\xB0\xB7\xE6\xAD\x8C\"\n}\n"));
}